

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O0

bool fs_set_cwd(string_view path)

{
  string_view path_00;
  bool bVar1;
  string_view local_78;
  error_category *local_68;
  char *local_60;
  path local_58;
  undefined1 local_30 [8];
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)local_30);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::current_path(&local_58,(error_code *)local_30);
  std::filesystem::__cxx11::path::~path(&local_58);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_30);
  if (bVar1) {
    local_68 = ec._M_cat;
    local_60 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"fs_set_cwd")
    ;
    path_00._M_str = local_60;
    path_00._M_len = (size_t)local_68;
    fs_print_error(path_00,local_78,(error_code *)local_30);
  }
  path_local._M_str._7_1_ = !bVar1;
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_set_cwd(std::string_view path)
{

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  std::filesystem::current_path(path, ec);
  if(!ec) FFS_LIKELY
    return true;
#elif defined(_WIN32)
  // windows.h https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-setcurrentdirectory
  if(SetCurrentDirectoryA(path.data()))  FFS_LIKELY
    return true;
#else
  // unistd.h https://www.man7.org/linux/man-pages/man2/chdir.2.html
  if(chdir(path.data()) == 0)  FFS_LIKELY
    return true;
#endif

  fs_print_error(path, __func__, ec);
  return false;
}